

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  int iVar1;
  secp256k1_fe r;
  secp256k1_fe sStack_48;
  
  secp256k1_fe_verify(x);
  secp256k1_gej_verify(a);
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&sStack_48,&a->z);
    secp256k1_fe_mul(&sStack_48,&sStack_48,x);
    iVar1 = secp256k1_fe_equal(&sStack_48,&a->x);
    return iVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/group_impl.h"
          ,0x186,"test condition failed: !a->infinity");
  abort();
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;
    SECP256K1_FE_VERIFY(x);
    SECP256K1_GEJ_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal(&r, &a->x);
}